

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_runner.h
# Opt level: O0

void AssertEqual<bool,bool>(bool *t,bool *u,string *hint)

{
  ostream *poVar1;
  runtime_error *this;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream os;
  string *hint_local;
  bool *u_local;
  bool *t_local;
  
  if ((*t & 1U) != (*u & 1U)) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar1 = std::operator<<((ostream *)local_198,"Assertion failed: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(*t & 1));
    poVar1 = std::operator<<(poVar1," != ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(*u & 1));
    poVar1 = std::operator<<(poVar1," hint: ");
    std::operator<<(poVar1,(string *)hint);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(this,local_1c8);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void AssertEqual(const T& t, const U& u,
                 const string& hint)
{
    if (t != u) {
        ostringstream os;
        os << "Assertion failed: " << t << " != " << u
           << " hint: " << hint;
        throw runtime_error(os.str());
    }
}